

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void __thiscall
cubeb_resampler_passthrough_duplex_callback_reordering_Test::TestBody
          (cubeb_resampler_passthrough_duplex_callback_reordering_Test *this)

{
  short sVar1;
  cubeb_resampler *resampler;
  long lVar2;
  int line;
  internal *input_frames_count;
  uint uVar3;
  short sVar4;
  float *array;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar5;
  short sVar6;
  long got;
  long local_1cb8;
  cubeb_resampler *local_1cb0;
  long zero;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ca0;
  uint local_1c94;
  long frames;
  long BUF_BASE_SIZE;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c80;
  closure c;
  AssertHelper local_1c70;
  long prebuffer_frames;
  cubeb_stream_params output_params;
  cubeb_stream_params input_params;
  float input_buffer_normal [256];
  float input_buffer_glitch [512];
  float output_buffer [512];
  float input_buffer_prebuffer [512];
  
  c.input_channel_count = 1;
  input_params.format = CUBEB_SAMPLE_FLOAT32LE;
  input_params.rate = 0xac44;
  output_params.channels = 2;
  output_params.format = CUBEB_SAMPLE_FLOAT32LE;
  output_params.rate = 0xac44;
  input_params.channels = c.input_channel_count;
  resampler = cubeb_resampler_create
                        ((cubeb_stream *)0x0,&input_params,&output_params,0xac44,
                         cb_passthrough_resampler_duplex,&c,CUBEB_RESAMPLER_QUALITY_VOIP,
                         CUBEB_RESAMPLER_RECLOCK_NONE);
  BUF_BASE_SIZE = 0x100;
  prebuffer_frames = 0x200 / (ulong)input_params.channels;
  lVar2 = seq<float>(input_buffer_prebuffer,1,0,prebuffer_frames);
  local_1cb0 = resampler;
  got = cubeb_resampler_fill(resampler,input_buffer_prebuffer,&prebuffer_frames,output_buffer,0x100)
  ;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)input_buffer_glitch,"prebuffer_frames","BUF_BASE_SIZE",&prebuffer_frames,
             &BUF_BASE_SIZE);
  if (input_buffer_glitch[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)input_buffer_normal);
    if (input_buffer_glitch._8_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)input_buffer_glitch._8_8_;
    }
    line = 0x2fe;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(input_buffer_glitch + 2));
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)input_buffer_glitch,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
    if (input_buffer_glitch[0]._0_1_ != '\0') {
      local_1cb8 = lVar2;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(input_buffer_glitch + 2));
      lVar2 = 0x100;
      sVar4 = 1;
      sVar6 = 0;
      uVar3 = 0;
      do {
        if ((int)lVar2 == 0x12d00) {
          cubeb_resampler_destroy(local_1cb0);
          return;
        }
        sVar1 = (short)((uVar3 & 0xffff) / 100) * 100;
        frames = 0x100;
        if (((int)lVar2 == 0x100) || ((short)(sVar6 + sVar1) != 0)) {
          if ((short)(sVar1 + sVar4) != 0) {
            local_1cb8 = seq<float>(input_buffer_normal,1,local_1cb8,0x100);
            zero = 0x100;
            goto LAB_001097f5;
          }
          array = input_buffer_glitch;
          local_1c94 = uVar3;
          local_1cb8 = seq<float>(array,1,local_1cb8,0x200);
          frames = 0x200;
          input_frames_count = (internal *)&frames;
          uVar3 = local_1c94;
        }
        else {
          zero = 0;
LAB_001097f5:
          array = input_buffer_normal;
          input_frames_count = (internal *)&zero;
        }
        got = cubeb_resampler_fill(local_1cb0,array,(long *)input_frames_count,output_buffer,0x100);
        is_seq<float>(output_buffer,2,0x100,lVar2);
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)&zero,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
        if ((char)zero == '\0') {
          testing::Message::Message((Message *)&local_1c80);
          if (local_1ca0.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((local_1ca0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c70,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                     ,0x31a,pcVar5);
          testing::internal::AssertHelper::operator=(&local_1c70,(Message *)&local_1c80);
          testing::internal::AssertHelper::~AssertHelper(&local_1c70);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_1c80);
          this_00 = &local_1ca0;
          goto LAB_0010997d;
        }
        lVar2 = lVar2 + 0x100;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_1ca0);
        sVar4 = sVar4 + -1;
        uVar3 = uVar3 + 1;
        sVar6 = sVar6 + -1;
      } while( true );
    }
    testing::Message::Message((Message *)input_buffer_normal);
    if (input_buffer_glitch._8_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)input_buffer_glitch._8_8_;
    }
    line = 0x2ff;
  }
  this_00 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(input_buffer_glitch + 2);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&zero,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
             ,line,pcVar5);
  testing::internal::AssertHelper::operator=((AssertHelper *)&zero,(Message *)input_buffer_normal);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&zero);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)input_buffer_normal);
LAB_0010997d:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  return;
}

Assistant:

TEST(cubeb, resampler_passthrough_duplex_callback_reordering)
{
  // Test that when pre-buffering on resampler creation, we can survive an input
  // callback being delayed.

  cubeb_stream_params input_params;
  cubeb_stream_params output_params;

  const int input_channels = 1;
  const int output_channels = 2;

  input_params.channels = input_channels;
  input_params.rate = 44100;
  input_params.format = CUBEB_SAMPLE_FLOAT32NE;

  output_params.channels = output_channels;
  output_params.rate = input_params.rate;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;

  int target_rate = input_params.rate;

  closure c;
  c.input_channel_count = input_channels;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params,
                           target_rate, cb_passthrough_resampler_duplex, &c,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  const long BUF_BASE_SIZE = 256;
  float input_buffer_prebuffer[input_channels * BUF_BASE_SIZE * 2];
  float input_buffer_glitch[input_channels * BUF_BASE_SIZE * 2];
  float input_buffer_normal[input_channels * BUF_BASE_SIZE];
  float output_buffer[output_channels * BUF_BASE_SIZE];

  long seq_idx = 0;
  long output_seq_idx = 0;

  long prebuffer_frames = ARRAY_LENGTH(input_buffer_prebuffer) / input_params.channels;
  seq_idx = seq(input_buffer_prebuffer, input_channels, seq_idx,
                prebuffer_frames);

  long got = cubeb_resampler_fill(resampler, input_buffer_prebuffer, &prebuffer_frames,
                                  output_buffer, BUF_BASE_SIZE);

  output_seq_idx += BUF_BASE_SIZE;

  // prebuffer_frames will hold the frames used by the resampler.
  ASSERT_EQ(prebuffer_frames, BUF_BASE_SIZE);
  ASSERT_EQ(got, BUF_BASE_SIZE);

  for (uint32_t i = 0; i < 300; i++) {
    long int frames = BUF_BASE_SIZE;
    // Simulate that sometimes, we don't have the input callback on time
    if (i != 0 && (i % 100) == 0) {
      long zero = 0;
      got = cubeb_resampler_fill(resampler, input_buffer_normal /* unused here */,
                                 &zero, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    } else if (i != 0 && (i % 100) == 1) {
      // if this is the case, the on the next iteration, we'll have twice the
      // amount of input frames
      seq_idx = seq(input_buffer_glitch, input_channels, seq_idx, BUF_BASE_SIZE * 2);
      frames = 2 * BUF_BASE_SIZE;
      got = cubeb_resampler_fill(resampler, input_buffer_glitch, &frames, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    } else {
       // normal case
      seq_idx = seq(input_buffer_normal, input_channels, seq_idx, BUF_BASE_SIZE);
      long normal_input_frame_count = 256;
      got = cubeb_resampler_fill(resampler, input_buffer_normal, &normal_input_frame_count, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    }
    ASSERT_EQ(got, BUF_BASE_SIZE);
  }

  cubeb_resampler_destroy(resampler);
}